

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O3

StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
* draco::CreatePointCloudDecoder
            (StatusOr<std::unique_ptr<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>_>
             *__return_storage_ptr__,int8_t method)

{
  PointCloudDecoder *this;
  undefined *puVar1;
  int iVar2;
  undefined7 in_register_00000031;
  long *local_60;
  long local_58;
  long local_50 [2];
  Code local_40;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  iVar2 = (int)CONCAT71(in_register_00000031,method);
  if (iVar2 == 1) {
    this = (PointCloudDecoder *)operator_new(0x58);
    this->_vptr_PointCloudDecoder = (_func_int **)0x0;
    this->point_cloud_ = (PointCloud *)0x0;
    (this->attributes_decoders_).
    super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
    (this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data + 0x10) = (pointer)0x0;
    this->buffer_ = (DecoderBuffer *)0x0;
    this->version_major_ = '\0';
    this->version_minor_ = '\0';
    *(undefined6 *)&this->field_0x4a = 0;
    this->options_ = (DecoderOptions *)0x0;
    PointCloudDecoder::PointCloudDecoder(this);
    puVar1 = &PointCloudKdTreeDecoder::vtable;
  }
  else {
    if (iVar2 != 0) {
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Unsupported encoding method.","");
      local_40 = DRACO_ERROR;
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,local_60,local_58 + (long)local_60);
      (__return_storage_ptr__->status_).code_ = local_40;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(__return_storage_ptr__->status_).error_msg_,local_38,
                 local_30 + (long)local_38);
      (__return_storage_ptr__->value_)._M_t.
      super___uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::PointCloudDecoder_*,_std::default_delete<draco::PointCloudDecoder>_>
      .super__Head_base<0UL,_draco::PointCloudDecoder_*,_false>._M_head_impl =
           (PointCloudDecoder *)0x0;
      if (local_38 != local_28) {
        operator_delete(local_38,local_28[0] + 1);
      }
      if (local_60 == local_50) {
        return __return_storage_ptr__;
      }
      operator_delete(local_60,local_50[0] + 1);
      return __return_storage_ptr__;
    }
    this = (PointCloudDecoder *)operator_new(0x58);
    this->_vptr_PointCloudDecoder = (_func_int **)0x0;
    this->point_cloud_ = (PointCloud *)0x0;
    (this->attributes_decoders_).
    super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl + 0x10) = (pointer)0x0;
    (this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl
     + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl
     + 0x10) = (pointer)0x0;
    this->buffer_ = (DecoderBuffer *)0x0;
    this->version_major_ = '\0';
    this->version_minor_ = '\0';
    *(undefined6 *)&this->field_0x4a = 0;
    this->options_ = (DecoderOptions *)0x0;
    PointCloudDecoder::PointCloudDecoder(this);
    puVar1 = &PointCloudSequentialDecoder::vtable;
  }
  this->_vptr_PointCloudDecoder = (_func_int **)(puVar1 + 0x10);
  (__return_storage_ptr__->status_).code_ = OK;
  (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
  (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
  (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->value_)._M_t.
  super___uniq_ptr_impl<draco::PointCloudDecoder,_std::default_delete<draco::PointCloudDecoder>_>.
  _M_t.
  super__Tuple_impl<0UL,_draco::PointCloudDecoder_*,_std::default_delete<draco::PointCloudDecoder>_>
  .super__Head_base<0UL,_draco::PointCloudDecoder_*,_false>._M_head_impl = this;
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<PointCloudDecoder>> CreatePointCloudDecoder(
    int8_t method) {
  if (method == POINT_CLOUD_SEQUENTIAL_ENCODING) {
    return std::unique_ptr<PointCloudDecoder>(
        new PointCloudSequentialDecoder());
  } else if (method == POINT_CLOUD_KD_TREE_ENCODING) {
    return std::unique_ptr<PointCloudDecoder>(new PointCloudKdTreeDecoder());
  }
  return Status(Status::DRACO_ERROR, "Unsupported encoding method.");
}